

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

int Abc_FlowRetime_IsAcrossCut(Abc_Obj_t *pObj,Abc_Obj_t *pNext)

{
  ushort uVar1;
  
  if ((undefined1  [24])
      ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x3) ==
      (undefined1  [24])0x2) {
    uVar1 = *(ushort *)(pManMR->pDataArray + (uint)pNext->Id);
    if (pManMR->fIsForward == 0) {
      if ((uVar1 & 9) != 0) {
        return 1;
      }
    }
    else if (((((uVar1 & 2) == 0) || ((uVar1 & 8) != 0)) ||
             (((uint)uVar1 & pManMR->constraintMask & 0x90) != 0)) ||
            ((*(uint *)&pNext->field_0x14 & 0xf) == 8)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
Abc_FlowRetime_IsAcrossCut( Abc_Obj_t *pObj, Abc_Obj_t *pNext ) {

  if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
    if (pManMR->fIsForward) {
      if (!FTEST(pNext, VISITED_R) || 
          (FTEST(pNext, BLOCK_OR_CONS) & pManMR->constraintMask)|| 
          FTEST(pNext, CROSS_BOUNDARY) || 
          Abc_ObjIsLatch(pNext))
        return 1;
    } else {
      if (FTEST(pNext, VISITED_E) ||
          FTEST(pNext, CROSS_BOUNDARY))
        return 1;
    }
  }
  
  return 0;
}